

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingTable.cpp
# Opt level: O2

bool __thiscall EncodingTable::load(EncodingTable *this,path *fileName,Encoding encoding)

{
  pointer pTVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  string hex;
  string local_358;
  string value;
  uchar hexBuffer [32];
  TextFile input;
  
  TextFile::TextFile(&input);
  iVar3 = TextFile::open(&input,(char *)fileName,0,(ulong)encoding);
  if ((char)iVar3 != '\0') {
    (this->hexData).size_ = 0;
    pTVar1 = (this->entries).
             super__Vector_base<EncodingTable::TableEntry,_std::allocator<EncodingTable::TableEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->entries).
        super__Vector_base<EncodingTable::TableEntry,_std::allocator<EncodingTable::TableEntry>_>.
        _M_impl.super__Vector_impl_data._M_finish != pTVar1) {
      (this->entries).
      super__Vector_base<EncodingTable::TableEntry,_std::allocator<EncodingTable::TableEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish = pTVar1;
    }
    setTerminationEntry(this,(uchar *)"",1);
    while( true ) {
      bVar2 = TextFile::atEnd(&input);
      if (bVar2) break;
      TextFile::readLine_abi_cxx11_(&local_358,&input);
      if ((local_358._M_string_length != 0) && (*local_358._M_dataplus._M_p != '*')) {
        if (*local_358._M_dataplus._M_p == '/') {
          std::__cxx11::string::substr((ulong)&hex,(ulong)&local_358);
          if ((0xffffffffffffffbf < hex._M_string_length - 0x41) &&
             (iVar4 = parseHexString(&hex,hexBuffer), iVar4 != -1)) {
            setTerminationEntry(this,hexBuffer,(long)iVar4);
          }
          std::__cxx11::string::~string((string *)&hex);
        }
        else {
          std::__cxx11::string::find((char)&local_358,0x3d);
          std::__cxx11::string::substr((ulong)&hex,(ulong)&local_358);
          std::__cxx11::string::substr((ulong)&value,(ulong)&local_358);
          if ((0xffffffffffffffbf < hex._M_string_length - 0x41) && (value._M_string_length != 0)) {
            iVar4 = parseHexString(&hex,hexBuffer);
            if (iVar4 == -1) {
              std::__cxx11::string::~string((string *)&value);
              std::__cxx11::string::~string((string *)&hex);
              goto LAB_0014738c;
            }
            addEntry(this,hexBuffer,(long)iVar4,&value);
          }
          std::__cxx11::string::~string((string *)&value);
          std::__cxx11::string::~string((string *)&hex);
        }
      }
LAB_0014738c:
      std::__cxx11::string::~string((string *)&local_358);
    }
  }
  TextFile::~TextFile(&input);
  return (bool)(char)iVar3;
}

Assistant:

bool EncodingTable::load(const fs::path& fileName, TextFile::Encoding encoding)
{
	unsigned char hexBuffer[MAXHEXLENGTH];

	TextFile input;
	if (!input.open(fileName,TextFile::Read,encoding))
		return false;

	hexData.clear();
	entries.clear();
	setTerminationEntry((unsigned char*)"\0",1);

	while (!input.atEnd())
	{
		const std::string &line = input.readLine();
		if (line.empty() || line[0] == '*') continue;
		
		if (line[0] == '/')
		{
			std::string hex = line.substr(1);
			if (hex.empty() || hex.length() > 2*MAXHEXLENGTH)
			{
				// error
				continue;
			}

			int length = parseHexString(hex,hexBuffer);
			if (length == -1)
			{
				// error
				continue;
			}

			setTerminationEntry(hexBuffer,length);
		} else {
			size_t pos = line.find(L'=');
			std::string hex = line.substr(0,pos);
			std::string value = line.substr(pos+1);

			if (hex.empty() || value.empty() || hex.length() > 2*MAXHEXLENGTH)
			{
				// error
				continue;
			}
			
			int length = parseHexString(hex,hexBuffer);
			if (length == -1)
			{
				// error
				continue;
			}

			addEntry(hexBuffer,length,value);
		}
	}

	return true;
}